

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quit.cpp
# Opt level: O2

void anon_unknown.dwarf_177be1::push
               (not_null<pstore::broker::command_processor_*> cp,string *message)

{
  undefined2 local_34;
  unsigned_short local_32;
  __single_object msg;
  unsigned_short local_24 [2];
  not_null<const_char_*> local_20;
  
  local_20.ptr_ = (message->_M_dataplus)._M_p;
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_20);
  pstore::log<pstore::logger::quoted>(info,"push command ",(quoted)local_20.ptr_);
  if (message->_M_string_length < 0xf5) {
    LOCK();
    UNLOCK();
    local_32 = 0;
    local_24 = (unsigned_short  [2])push::mid.super___atomic_base<unsigned_int>._M_i;
    local_34 = 1;
    push::mid.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         (__atomic_base<unsigned_int>)(push::mid.super___atomic_base<unsigned_int>._M_i + 1)._M_i;
    std::
    make_unique<pstore::brokerface::message_type,unsigned_int,unsigned_short,unsigned_short,std::__cxx11::string_const&>
              ((uint *)&msg,local_24,&local_32,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_34);
    pstore::broker::command_processor::push_command(cp.ptr_,&msg,(recorder *)0x0);
    std::
    unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
    ::~unique_ptr(&msg);
    return;
  }
  pstore::assert_failed
            ("message.length () <= pstore::brokerface::message_type::payload_chars",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/quit.cpp"
             ,0x37);
}

Assistant:

void push (not_null<pstore::broker::command_processor *> const cp,
               std::string const & message) {
        static std::atomic<std::uint32_t> mid{0};

        log (priority::info, "push command ", pstore::logger::quoted{message.c_str ()});

        PSTORE_ASSERT (message.length () <= pstore::brokerface::message_type::payload_chars);
        auto msg = std::make_unique<pstore::brokerface::message_type> (mid++, std::uint16_t{0},
                                                                       std::uint16_t{1}, message);
        cp->push_command (std::move (msg), nullptr);
    }